

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

kp_error_t help(kp_ctx *ctx,int argc,char **argv)

{
  kp_cmd *pkVar1;
  kp_error_t kVar2;
  
  if (_optind < argc) {
    pkVar1 = find_command(argv[_optind]);
    __printf_chk(1,"usage: %s %s\n\n",___progname,pkVar1->opts);
    kVar2 = 0;
    if (pkVar1->usage != (_func_void *)0x0) {
      (*pkVar1->usage)();
      kVar2 = 0;
    }
  }
  else {
    usage();
    kVar2 = 2;
  }
  return kVar2;
}

Assistant:

static kp_error_t
help(struct kp_ctx *ctx, int argc, char **argv)
{
	extern char *__progname;
	struct kp_cmd *cmd;

	if (optind >= argc) {
		usage();
		return KP_EINPUT;
	}

	cmd = find_command(argv[optind]);

	printf("usage: %s %s\n"
	       "\n", __progname, cmd->opts);
	if (cmd->usage) cmd->usage();

	return KP_SUCCESS;
}